

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::
vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
::reserve(vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
          *this,size_t n)

{
  optional<std::pair<int,_int>_> *poVar1;
  long lVar2;
  int i;
  ulong uVar3;
  
  if (this->nAlloc < n) {
    poVar1 = pmr::polymorphic_allocator<pstd::optional<std::pair<int,int>>>::
             allocate_object<pstd::optional<std::pair<int,int>>>
                       ((polymorphic_allocator<pstd::optional<std::pair<int,int>>> *)this,n);
    lVar2 = 0;
    for (uVar3 = 0; uVar3 < this->nStored; uVar3 = uVar3 + 1) {
      optional<std::pair<int,_int>_>::optional
                ((optional<std::pair<int,_int>_> *)((long)&poVar1->optionalValue + lVar2),
                 (optional<std::pair<int,_int>_> *)((long)&this->ptr->optionalValue + lVar2));
      optional<std::pair<int,_int>_>::~optional
                ((optional<std::pair<int,_int>_> *)((long)&this->ptr->optionalValue + lVar2));
      lVar2 = lVar2 + 0xc;
    }
    pmr::polymorphic_allocator<pstd::optional<std::pair<int,int>>>::
    deallocate_object<pstd::optional<std::pair<int,int>>>
              ((polymorphic_allocator<pstd::optional<std::pair<int,int>>> *)this,this->ptr,
               this->nAlloc);
    this->nAlloc = n;
    this->ptr = poVar1;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }